

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

bool anon_unknown.dwarf_1b0988::checkSampleCount
               (Array2D<unsigned_int> *sampleCount,int x1,int x2,int y1,int y2,int width)

{
  ostream *poVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  lVar3 = (long)y1;
  puVar2 = sampleCount->_data + sampleCount->_sizeY * lVar3;
  iVar5 = y1 * width;
  do {
    lVar6 = (long)x1;
    if (y2 < lVar3) {
LAB_0016fbf7:
      return y2 < lVar3;
    }
    for (; lVar6 <= x2; lVar6 = lVar6 + 1) {
      uVar4 = (iVar5 + (int)lVar6) % 10 + 1;
      if (puVar2[lVar6] != uVar4) {
        poVar1 = std::operator<<((ostream *)&std::cout,"sample count at ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar6);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar3);
        poVar1 = std::operator<<(poVar1,": ");
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        poVar1 = std::operator<<(poVar1,", should be ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar4);
        std::endl<char,std::char_traits<char>>(poVar1);
        std::ostream::flush();
        goto LAB_0016fbf7;
      }
    }
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + sampleCount->_sizeY;
    iVar5 = iVar5 + width;
  } while( true );
}

Assistant:

bool
checkSampleCount (
    Array2D<unsigned int>& sampleCount,
    int                    x1,
    int                    x2,
    int                    y1,
    int                    y2,
    int                    width)
{
    for (int i = y1; i <= y2; i++)
    {
        for (int j = x1; j <= x2; j++)
        {
            if (sampleCount[i][j] !=
                static_cast<unsigned int> (((i * width) + j) % 10 + 1))
            {
                cout << "sample count at " << j << ", " << i << ": "
                     << sampleCount[i][j] << ", should be "
                     << (i * width + j) % 10 + 1 << endl
                     << flush;
                return false;
            }
        }
    }
    return true;
}